

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O3

int fd_write(BIO *b,char *in,int inl)

{
  int iVar1;
  ssize_t sVar2;
  int return_value;
  
  sVar2 = write(b->num,in,(long)inl);
  BIO_clear_retry_flags(b);
  return_value = (int)sVar2;
  if (return_value < 1) {
    iVar1 = bio_errno_should_retry(return_value);
    if (iVar1 != 0) {
      BIO_set_retry_write(b);
    }
  }
  return return_value;
}

Assistant:

static int fd_write(BIO *b, const char *in, int inl) {
  int ret = (int)BORINGSSL_WRITE(b->num, in, inl);
  BIO_clear_retry_flags(b);
  if (ret <= 0) {
    if (bio_errno_should_retry(ret)) {
      BIO_set_retry_write(b);
    }
  }

  return ret;
}